

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

void art_free_node(art_node_t *node)

{
  byte bVar1;
  size_t i;
  long lVar2;
  ulong uVar3;
  
  if (((ulong)node & 1) != 0) {
switchD_001063f0_default:
    return;
  }
  switch(*node) {
  case (art_node_t)0x0:
    if (node[7] != (art_node_t)0x0) {
      uVar3 = 0;
      do {
        art_free_node(*(art_node_t **)(node + uVar3 * 8 + 0x10));
        uVar3 = uVar3 + 1;
      } while (uVar3 < (byte)node[7]);
    }
    break;
  case (art_node_t)0x1:
    if (node[7] != (art_node_t)0x0) {
      uVar3 = 0;
      do {
        art_free_node(*(art_node_t **)(node + uVar3 * 8 + 0x18));
        uVar3 = uVar3 + 1;
      } while (uVar3 < (byte)node[7]);
    }
    break;
  case (art_node_t)0x2:
    if (*(ulong *)(node + 8) != 0xffffffffffff) {
      uVar3 = *(ulong *)(node + 8) ^ 0xffffffffffff;
      do {
        lVar2 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        art_free_node(*(art_node_t **)(node + lVar2 * 8 + 0x110));
        bVar1 = (byte)lVar2 & 0x3f;
        uVar3 = uVar3 & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      } while (uVar3 != 0);
    }
    break;
  case (art_node_t)0x3:
    lVar2 = 0;
    do {
      if (*(art_node_t **)(node + lVar2 * 8 + 0x10) != (art_node_t *)0x0) {
        art_free_node(*(art_node_t **)(node + lVar2 * 8 + 0x10));
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
    break;
  default:
    goto switchD_001063f0_default;
  }
  roaring_free(node);
  return;
}

Assistant:

static void art_free_node(art_node_t *node) {
    if (art_is_leaf(node)) {
        // We leave it up to the user to free leaves.
        return;
    }
    switch (art_get_type((art_inner_node_t *)node)) {
        case ART_NODE4_TYPE:
            art_free_node4((art_node4_t *)node);
            break;
        case ART_NODE16_TYPE:
            art_free_node16((art_node16_t *)node);
            break;
        case ART_NODE48_TYPE:
            art_free_node48((art_node48_t *)node);
            break;
        case ART_NODE256_TYPE:
            art_free_node256((art_node256_t *)node);
            break;
        default:
            assert(false);
    }
}